

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<cni_root_namespace::foo_t>::duplicate(holder<cni_root_namespace::foo_t> *this)

{
  baseHolder *pbVar1;
  
  if ((_DAT_00340560 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::numeric>::allocator + _DAT_00340560 * 8);
    _DAT_00340560 = _DAT_00340560 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0032f600;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}